

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_group_base.hpp
# Opt level: O0

void __thiscall oqpi::task_group_base::~task_group_base(task_group_base *this)

{
  task_group_base *this_local;
  
  std::enable_shared_from_this<oqpi::task_group_base>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<oqpi::task_group_base>);
  task_base::~task_base(&this->super_task_base);
  return;
}

Assistant:

virtual ~task_group_base() = default;